

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::JUnitTestCaseData::add
          (JUnitTestCaseData *this,string *classname,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  std::
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>>
  ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
              *)name,in_RDI,in_RSI);
  return;
}

Assistant:

void add(const std::string& classname, const std::string& name) {
                testcases.emplace_back(classname, name);
            }